

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::CallExpr::CallExpr
          (CallExpr *this,Location *loc,shared_ptr<minja::Expression> *obj,ArgumentsExpression *a)

{
  ArgumentsExpression *in_RCX;
  ArgumentsExpression *in_RDI;
  
  Expression::Expression((Expression *)in_RCX,(Location *)in_RDI);
  (in_RDI->args).
  super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_do_evaluate_0041eda0;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  ArgumentsExpression::ArgumentsExpression(in_RCX,in_RDI);
  return;
}

Assistant:

CallExpr(const Location & loc, std::shared_ptr<Expression> && obj, ArgumentsExpression && a)
        : Expression(loc), object(std::move(obj)), args(std::move(a)) {}